

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

int __thiscall FileEntryInfo::allocateEntity(FileEntryInfo *this,int sectorNum)

{
  int iVar1;
  ulong uVar2;
  
  this->m_sectorNum = sectorNum;
  if ((this->m_fileType == RealtimeFile) || (iVar1 = 2, this->m_fileType == File)) {
    uVar2 = (long)(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    iVar1 = 1;
    if (0x70 < uVar2) {
      iVar1 = (int)uVar2;
      iVar1 = (int)((ulong)((long)(iVar1 + 10) * -0x7bdef7bd) >> 0x20) + iVar1 + 10;
      iVar1 = ((iVar1 >> 6) - (iVar1 >> 0x1f)) + 1;
    }
  }
  this->m_sectorsUsed = iVar1;
  return iVar1;
}

Assistant:

int FileEntryInfo::allocateEntity(const int sectorNum)
{
    m_sectorNum = sectorNum;
    if (!isFile())
        m_sectorsUsed = 2;  // restriction here: amount of files/subdirs is limited by sector size.
    else if (m_extents.size() <= MAX_EXTENTS_IN_EXTFILE)
        m_sectorsUsed = 1;
    else
    {
        const int sz = static_cast<int>(m_extents.size() - 1 - MAX_EXTENTS_IN_EXTFILE);
        m_sectorsUsed = 1 + (sz + MAX_EXTENTS_IN_EXTCONT - 1) / MAX_EXTENTS_IN_EXTCONT;
    }
    return m_sectorsUsed;
}